

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

LogicalCountExpr __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeBinary<mp::LogicalCountExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>> *this,Kind kind,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> lhs,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
          rhs)

{
  LogicalCountExpr LVar1;
  
  LVar1.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>)
       BasicExprFactory<std::allocator<char>_>::Allocate<mp::LogicalCountExpr>
                 ((BasicExprFactory<std::allocator<char>_> *)this,kind,0);
  ((ExprBase *)
  ((long)LVar1.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_ + 8))->
  impl_ = (Impl *)lhs.super_ExprBase.impl_;
  ((BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> *)
  ((long)LVar1.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_ + 0x10))
  ->super_ExprBase =
       (ExprBase)rhs.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_;
  return (LogicalCountExpr)
         LVar1.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_;
}

Assistant:

ExprType MakeBinary(expr::Kind kind, LHS lhs, RHS rhs) {
    MP_ASSERT(internal::Is<ExprType>(kind), "invalid expression kind");
    MP_ASSERT(lhs != 0 && rhs != 0, "invalid argument");
    typename ExprType::Impl *impl = Allocate<ExprType>(kind);
    impl->lhs = lhs.impl_;
    impl->rhs = rhs.impl_;
    return Expr::Create<ExprType>(impl);
  }